

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O2

Loop * __thiscall MixedArena::alloc<wasm::Loop>(MixedArena *this)

{
  Loop *pLVar1;
  
  pLVar1 = (Loop *)allocSpace(this,0x28,8);
  (pLVar1->super_SpecificExpression<(wasm::Expression::Id)3>).super_Expression._id = LoopId;
  (pLVar1->super_SpecificExpression<(wasm::Expression::Id)3>).super_Expression.type.id = 0;
  (pLVar1->name).super_IString.str._M_len = 0;
  (pLVar1->name).super_IString.str._M_str = (char *)0x0;
  return pLVar1;
}

Assistant:

T* alloc() {
    static_assert(alignof(T) <= MAX_ALIGN,
                  "maximum alignment not large enough");
    auto* ret = static_cast<T*>(allocSpace(sizeof(T), alignof(T)));
    new (ret) T(*this); // allocated objects receive the allocator, so they can
                        // allocate more later if necessary
    return ret;
  }